

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qthreadpool.cpp
# Opt level: O0

bool __thiscall QThreadPoolPrivate::tryStart(QThreadPoolPrivate *this,QRunnable *task)

{
  bool bVar1;
  QThreadPoolThread *this_00;
  QRunnable *in_RSI;
  QThreadPoolPrivate *in_RDI;
  long in_FS_OFFSET;
  QThread *unaff_retaddr;
  QRunnable *in_stack_00000010;
  QThreadPoolPrivate *in_stack_00000018;
  QThreadPoolThread *thread;
  int in_stack_0000004c;
  TimerType in_stack_ffffffffffffffa8;
  ForeverConstant in_stack_ffffffffffffffac;
  undefined7 in_stack_ffffffffffffffb0;
  undefined1 in_stack_ffffffffffffffb7;
  undefined7 in_stack_ffffffffffffffe0;
  undefined1 in_stack_ffffffffffffffe7;
  QThreadPoolPrivate *in_stack_ffffffffffffffe8;
  long lVar2;
  
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  bVar1 = QSet<QThreadPoolThread_*>::isEmpty((QSet<QThreadPoolThread_*> *)0x6ca8a6);
  if (bVar1) {
    startThread(in_stack_ffffffffffffffe8,
                (QRunnable *)CONCAT17(in_stack_ffffffffffffffe7,in_stack_ffffffffffffffe0));
    bVar1 = true;
  }
  else {
    bVar1 = areAllThreadsActive(in_RDI);
    if (bVar1) {
      bVar1 = false;
    }
    else {
      bVar1 = QList<QThreadPoolThread_*>::isEmpty((QList<QThreadPoolThread_*> *)0x6ca8f0);
      if (bVar1) {
        bVar1 = QList<QThreadPoolThread_*>::isEmpty((QList<QThreadPoolThread_*> *)0x6ca93d);
        if (bVar1) {
          startThread(in_stack_ffffffffffffffe8,
                      (QRunnable *)CONCAT17(in_stack_ffffffffffffffe7,in_stack_ffffffffffffffe0));
          bVar1 = true;
        }
        else {
          this_00 = QQueue<QThreadPoolThread_*>::dequeue((QQueue<QThreadPoolThread_*> *)0x6ca956);
          in_RDI->activeThreads = in_RDI->activeThreads + 1;
          this_00->runnable = in_RSI;
          QDeadlineTimer::QDeadlineTimer
                    ((QDeadlineTimer *)CONCAT17(in_stack_ffffffffffffffb7,in_stack_ffffffffffffffb0)
                     ,in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8);
          QThread::wait(&this_00->super_QThread,in_stack_ffffffffffffffe8);
          QThread::start(unaff_retaddr,(Priority)((ulong)lVar2 >> 0x20));
          bVar1 = true;
        }
      }
      else {
        enqueueTask(in_stack_00000018,in_stack_00000010,in_stack_0000004c);
        QList<QThreadPoolThread_*>::takeFirst
                  ((QList<QThreadPoolThread_*> *)
                   CONCAT17(in_stack_ffffffffffffffb7,in_stack_ffffffffffffffb0));
        QWaitCondition::wakeOne
                  ((QWaitCondition *)CONCAT17(in_stack_ffffffffffffffb7,in_stack_ffffffffffffffb0));
        bVar1 = true;
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
    return bVar1;
  }
  __stack_chk_fail();
}

Assistant:

bool QThreadPoolPrivate::tryStart(QRunnable *task)
{
    Q_ASSERT(task != nullptr);
    if (allThreads.isEmpty()) {
        // always create at least one thread
        startThread(task);
        return true;
    }

    // can't do anything if we're over the limit
    if (areAllThreadsActive())
        return false;

    if (!waitingThreads.isEmpty()) {
        // recycle an available thread
        enqueueTask(task);
        waitingThreads.takeFirst()->runnableReady.wakeOne();
        return true;
    }

    if (!expiredThreads.isEmpty()) {
        // restart an expired thread
        QThreadPoolThread *thread = expiredThreads.dequeue();
        Q_ASSERT(thread->runnable == nullptr);

        ++activeThreads;

        thread->runnable = task;

        // Ensure that the thread has actually finished, otherwise the following
        // start() has no effect.
        thread->wait();
        Q_ASSERT(thread->isFinished());
        thread->start(threadPriority);
        return true;
    }

    // start a new thread
    startThread(task);
    return true;
}